

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::SerializeWithCachedSizes
          (KNearestNeighborsClassifier *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  char *data;
  string *value;
  int64 value_00;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  KNearestNeighborsClassifier *this_local;
  
  bVar1 = has_nearestneighborsindex(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->nearestneighborsindex_->super_MessageLite,output);
  }
  bVar1 = has_numberofneighbors(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->numberofneighbors_->super_MessageLite,output);
  }
  bVar1 = has_stringclasslabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  bVar1 = has_int64classlabels(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  bVar1 = has_defaultstringlabel(this);
  if (bVar1) {
    defaultstringlabel_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    defaultstringlabel_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,
               "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
    value = defaultstringlabel_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x6e,value,output);
  }
  bVar1 = has_defaultint64label(this);
  if (bVar1) {
    value_00 = defaultint64label(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(0x6f,value_00,output);
  }
  bVar1 = has_uniformweighting(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->WeightingScheme_).uniformweighting_)->super_MessageLite,output);
  }
  bVar1 = has_inversedistanceweighting(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xd2,&((this->WeightingScheme_).uniformweighting_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.KNearestNeighborsClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
  if (this->has_nearestneighborsindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->nearestneighborsindex_, output);
  }

  // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
  if (this->has_numberofneighbors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->numberofneighbors_, output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // string defaultStringLabel = 110;
  if (has_defaultstringlabel()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->defaultstringlabel().data(), this->defaultstringlabel().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      110, this->defaultstringlabel(), output);
  }

  // int64 defaultInt64Label = 111;
  if (has_defaultint64label()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(111, this->defaultint64label(), output);
  }

  // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
  if (has_uniformweighting()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *WeightingScheme_.uniformweighting_, output);
  }

  // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
  if (has_inversedistanceweighting()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      210, *WeightingScheme_.inversedistanceweighting_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.KNearestNeighborsClassifier)
}